

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
either<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>,toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::character<(char)9>,toml::detail::exclude<toml::detail::in_range<(char)0,(char)25>>>,toml::detail::unlimited>>>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>,toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::character<(char)9>,toml::detail::exclude<toml::detail::in_range<(char)0,(char)25>>>,toml::detail::unlimited>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  *prVar1;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_68;
  
  prVar1 = &local_68;
  either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>::
  invoke<std::vector<char,std::allocator<char>>>
            (&local_68,
             (either<toml::detail::character<(char)32>,toml::detail::character<(char)9>> *)this,loc)
  ;
  if (local_68.is_ok_ == true) {
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,&local_68);
    this = (either<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>,toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::character<(char)9>,toml::detail::exclude<toml::detail::in_range<(char)0,(char)25>>>,toml::detail::unlimited>>>
            *)prVar1;
  }
  else {
    either<toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>,toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::character<(char)9>,toml::detail::exclude<toml::detail::in_range<(char)0,(char)25>>>,toml::detail::unlimited>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (__return_storage_ptr__,
               (either<toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>,toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::character<(char)9>,toml::detail::exclude<toml::detail::in_range<(char)0,(char)25>>>,toml::detail::unlimited>>>
                *)this,loc_00);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&local_68,(EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }